

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

DP_WS_Stream
EvpathInitWriter(CP_Services Svcs,void *CP_Stream,_SstParams *Params,attr_list DPAttrs,
                SstStats Stats)

{
  void *pvVar1;
  CManager p_Var2;
  SMPI_Comm comm;
  undefined8 uVar3;
  
  pvVar1 = calloc(1,0x70);
  p_Var2 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  pthread_mutex_init((pthread_mutex_t *)((long)pvVar1 + 0x18),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)((long)pvVar1 + 0x10));
  *(void **)((long)pvVar1 + 8) = CP_Stream;
  *(SstStats *)((long)pvVar1 + 0x68) = Stats;
  uVar3 = CMregister_format(p_Var2,EvpathReadRequestStructs);
  CMregister_handler(uVar3,EvpathReadRequestHandler,Svcs);
  uVar3 = CMregister_format(p_Var2,EvpathPreloadStructs);
  *(undefined8 *)((long)pvVar1 + 0x50) = uVar3;
  uVar3 = CMregister_format(p_Var2,EvpathReadReplyStructs);
  *(undefined8 *)((long)pvVar1 + 0x48) = uVar3;
  return pvVar1;
}

Assistant:

static DP_WS_Stream EvpathInitWriter(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params,
                                     attr_list DPAttrs, SstStats Stats)
{
    Evpath_WS_Stream Stream = malloc(sizeof(struct _Evpath_WS_Stream));
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    memset(Stream, 0, sizeof(struct _Evpath_WS_Stream));

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;

    /*
     * add a handler for read request messages
     */
    F = CMregister_format(cm, EvpathReadRequestStructs);
    CMregister_handler(F, EvpathReadRequestHandler, Svcs);

    /*
     * Register for sending preload messages
     */
    Stream->PreloadFormat = CMregister_format(cm, EvpathPreloadStructs);
    /*
     * register read reply message structure so we can send later
     */
    Stream->ReadReplyFormat = CMregister_format(cm, EvpathReadReplyStructs);

    //   We'd set an attribute here if we needed to communicate it to possible
    //   readers
    //    set_int_attr(DPAttrs, attr_atom_from_string("EVPATH_DP_Attr"),
    //    0xdeadbeef);

    return (void *)Stream;
}